

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeMeshes.cpp
# Opt level: O1

bool __thiscall
Assimp::OptimizeMeshesProcess::CanJoin
          (OptimizeMeshesProcess *this,uint a,uint b,uint verts,uint faces)

{
  pointer pMVar1;
  aiMesh **ppaVar2;
  aiMesh *paVar3;
  aiMesh *paVar4;
  bool bVar5;
  bool bVar6;
  
  pMVar1 = (this->meshes).
           super__Vector_base<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pMVar1[a].vertex_format == pMVar1[b].vertex_format) {
    ppaVar2 = this->mScene->mMeshes;
    paVar3 = ppaVar2[a];
    paVar4 = ppaVar2[b];
    if ((((this->max_verts == 0xffffffff) || (verts + paVar4->mNumVertices <= this->max_verts)) &&
        ((this->max_faces == 0xffffffff || (faces + paVar4->mNumFaces <= this->max_faces)))) &&
       (paVar3->mMaterialIndex == paVar4->mMaterialIndex)) {
      bVar5 = paVar3->mBones != (aiBone **)0x0;
      bVar6 = paVar3->mNumBones != 0;
      if (((bVar6 && bVar5) == (paVar4->mNumBones != 0 && paVar4->mBones != (aiBone **)0x0)) &&
         ((this->pts != true || (paVar3->mPrimitiveTypes == paVar4->mPrimitiveTypes)))) {
        return !bVar6 || !bVar5;
      }
    }
  }
  return false;
}

Assistant:

bool OptimizeMeshesProcess::CanJoin ( unsigned int a, unsigned int b, unsigned int verts, unsigned int faces )
{
    if (meshes[a].vertex_format != meshes[b].vertex_format)
        return false;

    aiMesh* ma = mScene->mMeshes[a], *mb = mScene->mMeshes[b];

    if ((NotSet != max_verts && verts+mb->mNumVertices > max_verts) ||
        (NotSet != max_faces && faces+mb->mNumFaces    > max_faces)) {
        return false;
    }

    // Never merge unskinned meshes with skinned meshes
    if (ma->mMaterialIndex != mb->mMaterialIndex || ma->HasBones() != mb->HasBones())
        return false;

    // Never merge meshes with different kinds of primitives if SortByPType did already
    // do its work. We would destroy everything again ...
    if (pts && ma->mPrimitiveTypes != mb->mPrimitiveTypes)
        return false;

    // If both meshes are skinned, check whether we have many bones defined in both meshes.
    // If yes, we can join them.
    if (ma->HasBones()) {
        // TODO
        return false;
    }
    return true;
}